

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O0

bool __thiscall
Calc::CalcParser::Reduce
          (CalcParser *this,Parse<SGParser::ParseStackGenericElement> *parse,uint productionID)

{
  char *pcVar1;
  uint productionID_local;
  Parse<SGParser::ParseStackGenericElement> *parse_local;
  CalcParser *this_local;
  
  switch(productionID) {
  case 6:
    SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    pcVar1 = (char *)std::__cxx11::string::data();
    translateNumber(this,pcVar1);
    break;
  case 7:
    SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    pcVar1 = (char *)std::__cxx11::string::data();
    translateIdentifier(this,pcVar1);
    break;
  case 8:
    translateUnaryOperation(this,productionID);
    break;
  default:
    break;
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    translateBinaryOperation(this,productionID);
    break;
  case 0xf:
  case 0x10:
    SGParser::Parse<SGParser::ParseStackGenericElement>::operator[](parse,0);
    pcVar1 = (char *)std::__cxx11::string::data();
    translateAssignment(this,pcVar1);
  }
  return true;
}

Assistant:

bool Reduce(Parse<ParseStackGenericElement>& parse, unsigned productionID) override {
        switch (static_cast<ProductionEnum>(productionID)) {
            case ProductionEnum::Number:
                translateNumber(parse[0].Str.data());
                break;
            case ProductionEnum::Addition:
            case ProductionEnum::Substruction:
            case ProductionEnum::Multiplication:
            case ProductionEnum::Division:
            case ProductionEnum::Exponentiation:
                translateBinaryOperation(static_cast<ProductionEnum>(productionID));
                break;
            case ProductionEnum::Negation:
                translateUnaryOperation(static_cast<ProductionEnum>(productionID));
                break;
            case ProductionEnum::Assignment:
            case ProductionEnum::Replication:
                translateAssignment(parse[0].Str.data());
                break;
            case ProductionEnum::Identifier:
                translateIdentifier(parse[0].Str.data());
                break;
            default:
                break;
        }
        return true;
    }